

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,BaseTextGenerator *generator,
          int recursion_budget)

{
  int iVar1;
  BaseTextGenerator *pBVar2;
  bool bVar3;
  int iVar4;
  Type TVar5;
  uint32_t v;
  uint64_t v_00;
  uint8_t *buffer;
  size_type sVar6;
  UnknownFieldSet *unknown_fields_00;
  char *pcVar7;
  string_view sVar8;
  basic_string_view<char,_std::char_traits<char>_> local_320;
  basic_string_view<char,_std::char_traits<char>_> local_310;
  basic_string_view<char,_std::char_traits<char>_> local_2f8;
  basic_string_view<char,_std::char_traits<char>_> local_2e8;
  basic_string_view<char,_std::char_traits<char>_> local_2d0;
  basic_string_view<char,_std::char_traits<char>_> local_2c0;
  int local_2ac;
  MessageFactory *local_2a8;
  size_t sStack_2a0;
  string local_290;
  string_view local_270;
  basic_string_view<char,_std::char_traits<char>_> local_260;
  basic_string_view<char,_std::char_traits<char>_> local_250;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  basic_string_view<char,_std::char_traits<char>_> local_200;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  undefined4 local_1c4;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1b0;
  undefined1 local_198 [8];
  UnknownFieldSet embedded_unknown_fields;
  undefined1 local_178 [8];
  CodedInputStream input_stream;
  string_view value;
  Hex local_110;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  int local_b4;
  Hex local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  int local_54;
  uint64_t local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  int local_34;
  UnknownField *local_30;
  UnknownField *field;
  int i;
  int recursion_budget_local;
  BaseTextGenerator *generator_local;
  UnknownFieldSet *unknown_fields_local;
  Printer *this_local;
  
  field._0_4_ = 0;
  field._4_4_ = recursion_budget;
  _i = generator;
  generator_local = (BaseTextGenerator *)unknown_fields;
  unknown_fields_local = (UnknownFieldSet *)this;
  do {
    iVar1 = (int)field;
    iVar4 = UnknownFieldSet::field_count((UnknownFieldSet *)generator_local);
    if (iVar4 <= iVar1) {
      return;
    }
    local_30 = UnknownFieldSet::field((UnknownFieldSet *)generator_local,(int)field);
    TVar5 = UnknownField::type(local_30);
    pBVar2 = _i;
    switch(TVar5) {
    case TYPE_VARINT:
      local_34 = UnknownField::number(local_30);
      OutOfLinePrintString<int>(pBVar2,&local_34);
      pBVar2 = _i;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,": ");
      (*pBVar2->_vptr_BaseTextGenerator[6])(pBVar2,local_48._M_len,local_48._M_str);
      pBVar2 = _i;
      if ((this->redact_debug_string_ & 1U) == 0) {
        local_50 = UnknownField::varint(local_30);
        OutOfLinePrintString<unsigned_long>(pBVar2,&local_50);
      }
      else {
        OutOfLinePrintString<char[16]>(_i,(char (*) [16])"UNKNOWN_VARINT ");
        OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
                  (_i,(basic_string_view<char,_std::char_traits<char>_> *)
                      &protobuf::(anonymous_namespace)::kFieldValueReplacement);
      }
      if ((this->single_line_mode_ & 1U) == 0) {
        BaseTextGenerator::PrintLiteral<2ul>(_i,(char (*) [2])0x718a9a);
      }
      else {
        BaseTextGenerator::PrintLiteral<2ul>(_i,(char (*) [2])0x851fe5);
      }
      break;
    case TYPE_FIXED32:
      local_54 = UnknownField::number(local_30);
      OutOfLinePrintString<int>(pBVar2,&local_54);
      pBVar2 = _i;
      if ((this->redact_debug_string_ & 1U) == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,": ");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"0x");
        (*pBVar2->_vptr_BaseTextGenerator[7])
                  (pBVar2,local_90._M_len,local_90._M_str,local_a0._M_len,local_a0._M_str);
        pBVar2 = _i;
        v = UnknownField::fixed32(local_30);
        absl::lts_20250127::Hex::Hex<unsigned_int>(&local_b0,v,kZeroPad8,(type *)0x0);
        OutOfLinePrintString<absl::lts_20250127::Hex>(pBVar2,&local_b0);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,": ");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_78,"UNKNOWN_FIXED32 ");
        (*pBVar2->_vptr_BaseTextGenerator[7])
                  (pBVar2,local_68._M_len,local_68._M_str,local_78._M_len,local_78._M_str);
        OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
                  (_i,(basic_string_view<char,_std::char_traits<char>_> *)
                      &protobuf::(anonymous_namespace)::kFieldValueReplacement);
      }
      if ((this->single_line_mode_ & 1U) == 0) {
        BaseTextGenerator::PrintLiteral<2ul>(_i,(char (*) [2])0x718a9a);
      }
      else {
        BaseTextGenerator::PrintLiteral<2ul>(_i,(char (*) [2])0x851fe5);
      }
      break;
    case TYPE_FIXED64:
      local_b4 = UnknownField::number(local_30);
      OutOfLinePrintString<int>(pBVar2,&local_b4);
      pBVar2 = _i;
      if ((this->redact_debug_string_ & 1U) == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0,": ");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100,"0x");
        (*pBVar2->_vptr_BaseTextGenerator[7])
                  (pBVar2,local_f0._M_len,local_f0._M_str,local_100._M_len,local_100._M_str);
        pBVar2 = _i;
        v_00 = UnknownField::fixed64(local_30);
        absl::lts_20250127::Hex::Hex<unsigned_long>(&local_110,v_00,kZeroPad16,(type *)0x0);
        OutOfLinePrintString<absl::lts_20250127::Hex>(pBVar2,&local_110);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,": ");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_d8,"UNKNOWN_FIXED64 ");
        (*pBVar2->_vptr_BaseTextGenerator[7])
                  (pBVar2,local_c8._M_len,local_c8._M_str,local_d8._M_len,local_d8._M_str);
        OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
                  (_i,(basic_string_view<char,_std::char_traits<char>_> *)
                      &protobuf::(anonymous_namespace)::kFieldValueReplacement);
      }
      if ((this->single_line_mode_ & 1U) == 0) {
        BaseTextGenerator::PrintLiteral<2ul>(_i,(char (*) [2])0x718a9a);
      }
      else {
        BaseTextGenerator::PrintLiteral<2ul>(_i,(char (*) [2])0x851fe5);
      }
      break;
    case TYPE_LENGTH_DELIMITED:
      value._M_str._4_4_ = UnknownField::number(local_30);
      OutOfLinePrintString<int>(pBVar2,(int *)((long)&value._M_str + 4));
      join_0x00000010_0x00000000_ = UnknownField::length_delimited(local_30);
      buffer = (uint8_t *)
               std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &input_stream.extension_factory_);
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &input_stream.extension_factory_);
      io::CodedInputStream::CodedInputStream((CodedInputStream *)local_178,buffer,(int)sVar6);
      io::CodedInputStream::SetRecursionLimit((CodedInputStream *)local_178,field._4_4_);
      UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)local_198);
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &input_stream.extension_factory_);
      if ((bVar3) || (field._4_4_ < 1)) {
LAB_005862a8:
        pBVar2 = _i;
        if ((this->redact_debug_string_ & 1U) == 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_250,": ");
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_260,"\"");
          pcVar7 = (char *)local_260._M_len;
          (*pBVar2->_vptr_BaseTextGenerator[7])
                    (pBVar2,local_250._M_len,local_250._M_str,local_260._M_len,local_260._M_str);
          pBVar2 = _i;
          local_2a8 = input_stream.extension_factory_;
          sStack_2a0 = value._M_len;
          sVar8._M_str = pcVar7;
          sVar8._M_len = value._M_len;
          absl::lts_20250127::CEscape_abi_cxx11_
                    (&local_290,(lts_20250127 *)input_stream.extension_factory_,sVar8);
          sVar8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_290);
          local_270 = sVar8;
          BaseTextGenerator::PrintString(pBVar2,sVar8);
          std::__cxx11::string::~string((string *)&local_290);
          if ((this->single_line_mode_ & 1U) == 0) {
            BaseTextGenerator::PrintLiteral<3ul>(_i,(char (*) [3])0x852b73);
          }
          else {
            BaseTextGenerator::PrintLiteral<3ul>(_i,(char (*) [3])0x85bc38);
          }
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_228,": ");
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_238,"UNKNOWN_STRING ");
          (*pBVar2->_vptr_BaseTextGenerator[7])
                    (pBVar2,local_228._M_len,local_228._M_str,local_238._M_len,local_238._M_str);
          OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
                    (_i,(basic_string_view<char,_std::char_traits<char>_> *)
                        &protobuf::(anonymous_namespace)::kFieldValueReplacement);
          if ((this->single_line_mode_ & 1U) == 0) {
            BaseTextGenerator::PrintLiteral<2ul>(_i,(char (*) [2])0x718a9a);
          }
          else {
            BaseTextGenerator::PrintLiteral<2ul>(_i,(char (*) [2])0x851fe5);
          }
        }
      }
      else {
        bVar3 = UnknownFieldSet::ParseFromCodedStream
                          ((UnknownFieldSet *)local_198,(CodedInputStream *)local_178);
        pBVar2 = _i;
        if (!bVar3) goto LAB_005862a8;
        if ((this->redact_debug_string_ & 1U) == 0) {
          if ((this->single_line_mode_ & 1U) == 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_200," ")
            ;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_210,"{\n");
            (*pBVar2->_vptr_BaseTextGenerator[7])
                      (pBVar2,local_200._M_len,local_200._M_str,local_210._M_len,local_210._M_str);
            (*_i->_vptr_BaseTextGenerator[2])();
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8," ")
            ;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_1e8,"{ ");
            (*pBVar2->_vptr_BaseTextGenerator[7])
                      (pBVar2,local_1d8._M_len,local_1d8._M_str,local_1e8._M_len,local_1e8._M_str);
          }
          PrintUnknownFields(this,(UnknownFieldSet *)local_198,_i,field._4_4_ + -1);
          if ((this->single_line_mode_ & 1U) == 0) {
            (*_i->_vptr_BaseTextGenerator[3])();
            BaseTextGenerator::PrintLiteral<3ul>(_i,(char (*) [3])0x7574ee);
          }
          else {
            BaseTextGenerator::PrintLiteral<3ul>(_i,(char (*) [3])"} ");
          }
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b0,": ");
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_1c0,"UNKNOWN_MESSAGE ");
          (*pBVar2->_vptr_BaseTextGenerator[7])
                    (pBVar2,local_1b0._M_len,local_1b0._M_str,local_1c0._M_len,local_1c0._M_str);
          OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
                    (_i,(basic_string_view<char,_std::char_traits<char>_> *)
                        &protobuf::(anonymous_namespace)::kFieldValueReplacement);
          if ((this->single_line_mode_ & 1U) == 0) {
            BaseTextGenerator::PrintLiteral<2ul>(_i,(char (*) [2])0x718a9a);
          }
          else {
            BaseTextGenerator::PrintLiteral<2ul>(_i,(char (*) [2])0x851fe5);
          }
        }
      }
      local_1c4 = 5;
      UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)local_198);
      io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_178);
      break;
    case TYPE_GROUP:
      local_2ac = UnknownField::number(local_30);
      OutOfLinePrintString<int>(pBVar2,&local_2ac);
      pBVar2 = _i;
      if ((this->redact_debug_string_ & 1U) == 0) {
        if ((this->single_line_mode_ & 1U) == 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_310," ");
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_320,"{\n")
          ;
          (*pBVar2->_vptr_BaseTextGenerator[7])
                    (pBVar2,local_310._M_len,local_310._M_str,local_320._M_len,local_320._M_str);
          (*_i->_vptr_BaseTextGenerator[2])();
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e8," ");
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2f8,"{ ");
          (*pBVar2->_vptr_BaseTextGenerator[7])
                    (pBVar2,local_2e8._M_len,local_2e8._M_str,local_2f8._M_len,local_2f8._M_str);
        }
        unknown_fields_00 = UnknownField::group(local_30);
        PrintUnknownFields(this,unknown_fields_00,_i,field._4_4_ + -1);
        if ((this->single_line_mode_ & 1U) == 0) {
          (*_i->_vptr_BaseTextGenerator[3])();
          BaseTextGenerator::PrintLiteral<3ul>(_i,(char (*) [3])0x7574ee);
        }
        else {
          BaseTextGenerator::PrintLiteral<3ul>(_i,(char (*) [3])"} ");
        }
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2c0,": ");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_2d0,"UNKNOWN_GROUP ");
        (*pBVar2->_vptr_BaseTextGenerator[7])
                  (pBVar2,local_2c0._M_len,local_2c0._M_str,local_2d0._M_len,local_2d0._M_str);
        OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
                  (_i,(basic_string_view<char,_std::char_traits<char>_> *)
                      &protobuf::(anonymous_namespace)::kFieldValueReplacement);
        if ((this->single_line_mode_ & 1U) == 0) {
          BaseTextGenerator::PrintLiteral<2ul>(_i,(char (*) [2])0x718a9a);
        }
        else {
          BaseTextGenerator::PrintLiteral<2ul>(_i,(char (*) [2])0x851fe5);
        }
      }
    }
    field._0_4_ = (int)field + 1;
  } while( true );
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, BaseTextGenerator* generator,
    int recursion_budget) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        OutOfLinePrintString(generator, field.number());
        generator->PrintMaybeWithMarker(MarkerToken(), ": ");
        if (redact_debug_string_) {
          OutOfLinePrintString(generator, "UNKNOWN_VARINT ");
          OutOfLinePrintString(generator, kFieldValueReplacement);
        } else {
          OutOfLinePrintString(generator, field.varint());
        }
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        OutOfLinePrintString(generator, field.number());
        if (redact_debug_string_) {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                          "UNKNOWN_FIXED32 ");
          OutOfLinePrintString(generator, kFieldValueReplacement);
        } else {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ", "0x");
          OutOfLinePrintString(generator,
                               absl::Hex(field.fixed32(), absl::kZeroPad8));
        }
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        OutOfLinePrintString(generator, field.number());
        if (redact_debug_string_) {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                          "UNKNOWN_FIXED64 ");
          OutOfLinePrintString(generator, kFieldValueReplacement);
        } else {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ", "0x");
          OutOfLinePrintString(generator,
                               absl::Hex(field.fixed64(), absl::kZeroPad16));
        }
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        OutOfLinePrintString(generator, field.number());
        const absl::string_view value = field.length_delimited();
        // We create a CodedInputStream so that we can adhere to our recursion
        // budget when we attempt to parse the data. UnknownFieldSet parsing is
        // recursive because of groups.
        io::CodedInputStream input_stream(
            reinterpret_cast<const uint8_t*>(value.data()), value.size());
        input_stream.SetRecursionLimit(recursion_budget);
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && recursion_budget > 0 &&
            embedded_unknown_fields.ParseFromCodedStream(&input_stream)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (redact_debug_string_) {
            generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                            "UNKNOWN_MESSAGE ");
            OutOfLinePrintString(generator, kFieldValueReplacement);
            if (single_line_mode_) {
              generator->PrintLiteral(" ");
            } else {
              generator->PrintLiteral("\n");
            }
            break;
          }
          if (single_line_mode_) {
            generator->PrintMaybeWithMarker(MarkerToken(), " ", "{ ");
          } else {
            generator->PrintMaybeWithMarker(MarkerToken(), " ", "{\n");
            generator->Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator,
                             recursion_budget - 1);
          if (single_line_mode_) {
            generator->PrintLiteral("} ");
          } else {
            generator->Outdent();
            generator->PrintLiteral("}\n");
          }
        } else {
          // This field is not parseable as a Message (or we ran out of
          // recursion budget). So it is probably just a plain string.
          if (redact_debug_string_) {
            generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                            "UNKNOWN_STRING ");
            OutOfLinePrintString(generator, kFieldValueReplacement);
            if (single_line_mode_) {
              generator->PrintLiteral(" ");
            } else {
              generator->PrintLiteral("\n");
            }
            break;
          }
          generator->PrintMaybeWithMarker(MarkerToken(), ": ", "\"");
          generator->PrintString(absl::CEscape(value));
          if (single_line_mode_) {
            generator->PrintLiteral("\" ");
          } else {
            generator->PrintLiteral("\"\n");
          }
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        OutOfLinePrintString(generator, field.number());
        if (redact_debug_string_) {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                          "UNKNOWN_GROUP ");
          OutOfLinePrintString(generator, kFieldValueReplacement);
          if (single_line_mode_) {
            generator->PrintLiteral(" ");
          } else {
            generator->PrintLiteral("\n");
          }
          break;
        }
        if (single_line_mode_) {
          generator->PrintMaybeWithMarker(MarkerToken(), " ", "{ ");
        } else {
          generator->PrintMaybeWithMarker(MarkerToken(), " ", "{\n");
          generator->Indent();
        }
        // For groups, we recurse without checking the budget. This is OK,
        // because if the groups were too deeply nested then we would have
        // already rejected the message when we originally parsed it.
        PrintUnknownFields(field.group(), generator, recursion_budget - 1);
        if (single_line_mode_) {
          generator->PrintLiteral("} ");
        } else {
          generator->Outdent();
          generator->PrintLiteral("}\n");
        }
        break;
    }
  }
}